

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decUtil.c
# Opt level: O2

DdNode * Dec_GraphDeriveBdd(DdManager *dd,Dec_Graph_t *pGraph)

{
  uint uVar1;
  Dec_Node_t *pDVar2;
  int i;
  uint uVar3;
  DdNode *pDVar4;
  long lVar5;
  char *__assertion;
  long lVar6;
  undefined1 *puVar7;
  long lVar8;
  
  uVar3 = pGraph->nLeaves;
  if ((int)uVar3 < 0) {
    __assertion = "Dec_GraphLeaveNum(pGraph) >= 0";
    uVar3 = 0x39;
  }
  else {
    if ((int)uVar3 <= pGraph->nSize) {
      if (pGraph->fConst == 0) {
        if (((uint)pGraph->eRoot >> 1 & 0x3fffffff) < uVar3) {
          i = Dec_GraphVarInt(pGraph);
          pDVar4 = Cudd_bddIthVar(dd,i);
        }
        else {
          lVar6 = 0;
          puVar7 = (undefined1 *)0x0;
          for (lVar8 = 0; lVar5 = (long)(int)uVar3, lVar8 < lVar5; lVar8 = lVar8 + 1) {
            pDVar2 = pGraph->pNodes;
            puVar7 = &(pDVar2->eEdge0).field_0x0 + lVar6;
            pDVar4 = Cudd_bddIthVar(dd,(int)lVar8);
            *(DdNode **)((long)&pDVar2->field_2 + lVar6) = pDVar4;
            uVar3 = pGraph->nLeaves;
            lVar6 = lVar6 + 0x18;
          }
          lVar6 = lVar5 * 0x18;
          for (; lVar5 < pGraph->nSize; lVar5 = lVar5 + 1) {
            pDVar2 = pGraph->pNodes;
            puVar7 = &(pDVar2->eEdge0).field_0x0 + lVar6;
            uVar3 = *(uint *)(&(pDVar2->eEdge0).field_0x0 + lVar6);
            uVar1 = *(uint *)(&(pDVar2->eEdge1).field_0x0 + lVar6);
            pDVar4 = Cudd_bddAnd(dd,(DdNode *)
                                    ((ulong)(uVar3 & 1) ^
                                    (ulong)pDVar2[uVar3 >> 1 & 0x3fffffff].field_2.pFunc),
                                 (DdNode *)
                                 ((ulong)(uVar1 & 1) ^
                                 (ulong)pDVar2[uVar1 >> 1 & 0x3fffffff].field_2.pFunc));
            *(DdNode **)((long)&pDVar2->field_2 + lVar6) = pDVar4;
            Cudd_Ref(pDVar4);
            lVar6 = lVar6 + 0x18;
          }
          pDVar4 = *(DdNode **)(puVar7 + 8);
          Cudd_Ref(pDVar4);
          lVar6 = (long)pGraph->nLeaves;
          lVar8 = lVar6 * 0x18 + 8;
          for (; lVar6 < pGraph->nSize; lVar6 = lVar6 + 1) {
            Cudd_RecursiveDeref(dd,*(DdNode **)(&(pGraph->pNodes->eEdge0).field_0x0 + lVar8));
            lVar8 = lVar8 + 0x18;
          }
          Cudd_Deref(pDVar4);
        }
      }
      else {
        pDVar4 = dd->one;
      }
      return (DdNode *)((ulong)((uint)pGraph->eRoot & 1) ^ (ulong)pDVar4);
    }
    __assertion = "Dec_GraphLeaveNum(pGraph) <= pGraph->nSize";
    uVar3 = 0x3a;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/dec/decUtil.c"
                ,uVar3,"DdNode *Dec_GraphDeriveBdd(DdManager *, Dec_Graph_t *)");
}

Assistant:

DdNode * Dec_GraphDeriveBdd( DdManager * dd, Dec_Graph_t * pGraph )
{
    DdNode * bFunc, * bFunc0, * bFunc1;
    Dec_Node_t * pNode = NULL; // Suppress "might be used uninitialized"
    int i;

    // sanity checks
    assert( Dec_GraphLeaveNum(pGraph) >= 0 );
    assert( Dec_GraphLeaveNum(pGraph) <= pGraph->nSize );

    // check for constant function
    if ( Dec_GraphIsConst(pGraph) )
        return Cudd_NotCond( b1, Dec_GraphIsComplement(pGraph) );
    // check for a literal
    if ( Dec_GraphIsVar(pGraph) )
        return Cudd_NotCond( Cudd_bddIthVar(dd, Dec_GraphVarInt(pGraph)), Dec_GraphIsComplement(pGraph) );

    // assign the elementary variables
    Dec_GraphForEachLeaf( pGraph, pNode, i )
        pNode->pFunc = Cudd_bddIthVar( dd, i );

    // compute the function for each internal node
    Dec_GraphForEachNode( pGraph, pNode, i )
    {
        bFunc0 = Cudd_NotCond( Dec_GraphNode(pGraph, pNode->eEdge0.Node)->pFunc, pNode->eEdge0.fCompl ); 
        bFunc1 = Cudd_NotCond( Dec_GraphNode(pGraph, pNode->eEdge1.Node)->pFunc, pNode->eEdge1.fCompl ); 
        pNode->pFunc = Cudd_bddAnd( dd, bFunc0, bFunc1 );   Cudd_Ref( (DdNode *)pNode->pFunc );
    }

    // deref the intermediate results
    bFunc = (DdNode *)pNode->pFunc;   Cudd_Ref( bFunc );
    Dec_GraphForEachNode( pGraph, pNode, i )
        Cudd_RecursiveDeref( dd, (DdNode *)pNode->pFunc );
    Cudd_Deref( bFunc );

    // complement the result if necessary
    return Cudd_NotCond( bFunc, Dec_GraphIsComplement(pGraph) );
}